

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiDockNode * ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode *node,ImVec2 pos)

{
  bool bVar1;
  ImGuiDockNode *hovered_node_1;
  ImGuiDockNode *hovered_node;
  bool inside;
  undefined1 local_34 [8];
  ImRect r;
  float dock_spacing;
  ImGuiDockNode *node_local;
  ImVec2 pos_local;
  
  if ((*(ushort *)&node->field_0xbc >> 9 & 1) == 0) {
    pos_local.x = 0.0;
    pos_local.y = 0.0;
  }
  else {
    r.Max.x = 0.0;
    unique0x100000eb = (ImVec2)node;
    node_local = (ImGuiDockNode *)pos;
    register0x00001200 = operator+(&node->Pos,&node->Size);
    ImRect::ImRect((ImRect *)local_34,&node->Pos,(ImVec2 *)((long)&hovered_node + 4));
    ImRect::Expand((ImRect *)local_34,0.0);
    hovered_node._3_1_ = ImRect::Contains((ImRect *)local_34,(ImVec2 *)&node_local);
    if ((bool)hovered_node._3_1_) {
      bVar1 = ImGuiDockNode::IsLeafNode((ImGuiDockNode *)stack0xffffffffffffffe0);
      if (bVar1) {
        pos_local = stack0xffffffffffffffe0;
      }
      else {
        pos_local = (ImVec2)DockNodeTreeFindVisibleNodeByPos
                                      (*(ImGuiDockNode **)((long)stack0xffffffffffffffe0 + 0x20),
                                       (ImVec2)node_local);
        if ((pos_local == (ImVec2)0x0) &&
           (pos_local = (ImVec2)DockNodeTreeFindVisibleNodeByPos
                                          (*(ImGuiDockNode **)((long)stack0xffffffffffffffe0 + 0x28)
                                           ,(ImVec2)node_local), pos_local == (ImVec2)0x0)) {
          pos_local.x = 0.0;
          pos_local.y = 0.0;
        }
      }
    }
    else {
      pos_local.x = 0.0;
      pos_local.y = 0.0;
    }
  }
  return (ImGuiDockNode *)pos_local;
}

Assistant:

ImGuiDockNode* ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode* node, ImVec2 pos)
{
    if (!node->IsVisible)
        return NULL;

    const float dock_spacing = 0.0f;// g.Style.ItemInnerSpacing.x; // FIXME: Relation to DOCKING_SPLITTER_SIZE?
    ImRect r(node->Pos, node->Pos + node->Size);
    r.Expand(dock_spacing * 0.5f);
    bool inside = r.Contains(pos);
    if (!inside)
        return NULL;

    if (node->IsLeafNode())
        return node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[0], pos))
        return hovered_node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[1], pos))
        return hovered_node;

    return NULL;
}